

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-powerpc.cpp
# Opt level: O0

void __thiscall
powerpc_test_cpu::test_instruction_RRS__(powerpc_test_cpu *this,char *insn,uint32_t opcode)

{
  int iVar1;
  int local_3c;
  uint32_t ra;
  int i;
  uint32_t sh;
  int j;
  int n_values;
  uint32_t local_1c;
  char *pcStack_18;
  uint32_t opcode_local;
  char *insn_local;
  powerpc_test_cpu *this_local;
  
  local_1c = opcode;
  pcStack_18 = insn;
  insn_local = (char *)this;
  if (test_instruction_RRS__(char_const*,unsigned_int)::code == '\0') {
    iVar1 = __cxa_guard_acquire();
    if (iVar1 != 0) {
      test_instruction_RRS__::code[0] = 0;
      test_instruction_RRS__::code[1] = 0x4e800020;
      test_instruction_RRS__::code[2] = POWERPC_MR(0,4);
      test_instruction_RRS__::code[3] = 0;
      test_instruction_RRS__::code[4] = 0x4e800020;
      __cxa_guard_release(&test_instruction_RRS__(char_const*,unsigned_int)::code);
    }
  }
  for (i = 0; i < 0x20; i = i + 1) {
    bit_field<16,_20>::insert(&local_1c,i);
    test_instruction_RRS__::code[3] = local_1c;
    test_instruction_RRS__::code[0] = local_1c;
    bit_field<11,_15>::insert(test_instruction_RRS__::code + 3,0);
    flush_icache_range(this,test_instruction_RRS__::code,0x14);
    for (local_3c = 0; local_3c < 0x24; local_3c = local_3c + 1) {
      test_one(this,test_instruction_RRS__::code,pcStack_18,reg_values[local_3c],i,0,0);
    }
  }
  return;
}

Assistant:

void powerpc_test_cpu::test_instruction_RRS__(const char *insn, uint32_t opcode)
{
	// Test code
	static uint32_t code[] = {
		POWERPC_ILLEGAL, POWERPC_BLR,
		POWERPC_MR(0, RA), POWERPC_ILLEGAL, POWERPC_BLR
	};

	// Input values
	const int n_values = sizeof(reg_values)/sizeof(reg_values[0]);

	for (int j = 0; j < 32; j++) {
		const uint32_t sh = j;
		SH_field::insert(opcode, sh);
		code[0] = code[3] = opcode;
		rA_field::insert(code[3], 0);
		flush_icache_range(code, sizeof(code));
		for (int i = 0; i < n_values; i++) {
			const uint32_t ra = reg_values[i];
			test_one(&code[0], insn, ra, sh, 0);
		}
	}
}